

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int libssh2_session_free(LIBSSH2_SESSION *session)

{
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var1;
  LIBSSH2_CRYPT_METHOD *pLVar2;
  LIBSSH2_COMP_METHOD *pLVar3;
  _func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *p_Var4;
  _LIBSSH2_MAC_METHOD *p_Var5;
  uchar *puVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  time_t start_time;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_LISTENER *listener;
  list_node *entry;
  
  start_time = time((time_t *)0x0);
  do {
    if (session->free_state == libssh2_NB_state_idle) {
      session->free_state = libssh2_NB_state_created;
    }
    if (session->free_state == libssh2_NB_state_created) {
      do {
        channel = (LIBSSH2_CHANNEL *)_libssh2_list_first(&session->channels);
        if (channel == (LIBSSH2_CHANNEL *)0x0) {
          session->free_state = libssh2_NB_state_sent;
          goto LAB_00123d05;
        }
        iVar9 = _libssh2_channel_free(channel);
      } while (iVar9 != -0x25);
LAB_00123d28:
      iVar9 = -0x25;
      bVar8 = true;
    }
    else {
LAB_00123d05:
      if (session->free_state == libssh2_NB_state_sent) {
        do {
          listener = (LIBSSH2_LISTENER *)_libssh2_list_first(&session->listeners);
          if (listener == (LIBSSH2_LISTENER *)0x0) {
            session->free_state = libssh2_NB_state_sent1;
            goto LAB_00123d3e;
          }
          iVar9 = _libssh2_channel_forward_cancel(listener);
        } while (iVar9 != -0x25);
        goto LAB_00123d28;
      }
LAB_00123d3e:
      if ((session->state & 4) != 0) {
        if ((session->hostkey != (LIBSSH2_HOSTKEY_METHOD *)0x0) &&
           (p_Var1 = session->hostkey->dtor,
           p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0)) {
          (*p_Var1)(session,&session->server_hostkey_abstract);
        }
        pLVar2 = (session->local).crypt;
        if ((pLVar2 != (LIBSSH2_CRYPT_METHOD *)0x0) &&
           (p_Var1 = pLVar2->dtor, p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0)) {
          (*p_Var1)(session,&(session->local).crypt_abstract);
        }
        pLVar3 = (session->local).comp;
        if ((pLVar3 != (LIBSSH2_COMP_METHOD *)0x0) &&
           (p_Var4 = pLVar3->dtor, p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0))
        {
          (*p_Var4)(session,1,&(session->local).comp_abstract);
        }
        p_Var5 = (session->local).mac;
        if ((p_Var5 != (_LIBSSH2_MAC_METHOD *)0x0) &&
           (p_Var1 = p_Var5->dtor, p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0)) {
          (*p_Var1)(session,&(session->local).mac_abstract);
        }
        pLVar2 = (session->remote).crypt;
        if ((pLVar2 != (LIBSSH2_CRYPT_METHOD *)0x0) &&
           (p_Var1 = pLVar2->dtor, p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0)) {
          (*p_Var1)(session,&(session->remote).crypt_abstract);
        }
        pLVar3 = (session->remote).comp;
        if ((pLVar3 != (LIBSSH2_COMP_METHOD *)0x0) &&
           (p_Var4 = pLVar3->dtor, p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0))
        {
          (*p_Var4)(session,0,&(session->remote).comp_abstract);
        }
        p_Var5 = (session->remote).mac;
        if ((p_Var5 != (_LIBSSH2_MAC_METHOD *)0x0) &&
           (p_Var1 = p_Var5->dtor, p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0)) {
          (*p_Var1)(session,&(session->remote).mac_abstract);
        }
        if (session->session_id != (uchar *)0x0) {
          (*session->free)(session->session_id,&session->abstract);
        }
      }
      puVar6 = (session->remote).banner;
      if (puVar6 != (uchar *)0x0) {
        (*session->free)(puVar6,&session->abstract);
      }
      puVar6 = (session->local).banner;
      if (puVar6 != (uchar *)0x0) {
        (*session->free)(puVar6,&session->abstract);
      }
      if (session->kex_prefs != (char *)0x0) {
        (*session->free)(session->kex_prefs,&session->abstract);
      }
      if (session->hostkey_prefs != (char *)0x0) {
        (*session->free)(session->hostkey_prefs,&session->abstract);
      }
      puVar6 = (session->local).kexinit;
      if (puVar6 != (uchar *)0x0) {
        (*session->free)(puVar6,&session->abstract);
      }
      pcVar7 = (session->local).crypt_prefs;
      if (pcVar7 != (char *)0x0) {
        (*session->free)(pcVar7,&session->abstract);
      }
      pcVar7 = (session->local).mac_prefs;
      if (pcVar7 != (char *)0x0) {
        (*session->free)(pcVar7,&session->abstract);
      }
      pcVar7 = (session->local).comp_prefs;
      if (pcVar7 != (char *)0x0) {
        (*session->free)(pcVar7,&session->abstract);
      }
      pcVar7 = (session->local).lang_prefs;
      if (pcVar7 != (char *)0x0) {
        (*session->free)(pcVar7,&session->abstract);
      }
      puVar6 = (session->remote).kexinit;
      if (puVar6 != (uchar *)0x0) {
        (*session->free)(puVar6,&session->abstract);
      }
      pcVar7 = (session->remote).crypt_prefs;
      if (pcVar7 != (char *)0x0) {
        (*session->free)(pcVar7,&session->abstract);
      }
      pcVar7 = (session->remote).mac_prefs;
      if (pcVar7 != (char *)0x0) {
        (*session->free)(pcVar7,&session->abstract);
      }
      pcVar7 = (session->remote).comp_prefs;
      if (pcVar7 != (char *)0x0) {
        (*session->free)(pcVar7,&session->abstract);
      }
      pcVar7 = (session->remote).lang_prefs;
      if (pcVar7 != (char *)0x0) {
        (*session->free)(pcVar7,&session->abstract);
      }
      if (session->server_sign_algorithms != (char *)0x0) {
        (*session->free)(session->server_sign_algorithms,&session->abstract);
      }
      if (session->sign_algo_prefs != (char *)0x0) {
        (*session->free)(session->sign_algo_prefs,&session->abstract);
      }
      if (session->kexinit_data != (uchar *)0x0) {
        (*session->free)(session->kexinit_data,&session->abstract);
      }
      if (session->startup_data != (uchar *)0x0) {
        (*session->free)(session->startup_data,&session->abstract);
      }
      if (session->userauth_list_data != (uchar *)0x0) {
        (*session->free)(session->userauth_list_data,&session->abstract);
      }
      if (session->userauth_banner != (char *)0x0) {
        (*session->free)(session->userauth_banner,&session->abstract);
      }
      if (session->userauth_pswd_data != (uchar *)0x0) {
        (*session->free)(session->userauth_pswd_data,&session->abstract);
      }
      if (session->userauth_pswd_newpw != (char *)0x0) {
        (*session->free)(session->userauth_pswd_newpw,&session->abstract);
      }
      if (session->userauth_host_packet != (uchar *)0x0) {
        (*session->free)(session->userauth_host_packet,&session->abstract);
      }
      if (session->userauth_host_method != (uchar *)0x0) {
        (*session->free)(session->userauth_host_method,&session->abstract);
      }
      if (session->userauth_host_data != (uchar *)0x0) {
        (*session->free)(session->userauth_host_data,&session->abstract);
      }
      if (session->userauth_pblc_data != (uchar *)0x0) {
        (*session->free)(session->userauth_pblc_data,&session->abstract);
      }
      if (session->userauth_pblc_packet != (uchar *)0x0) {
        (*session->free)(session->userauth_pblc_packet,&session->abstract);
      }
      if (session->userauth_pblc_method != (uchar *)0x0) {
        (*session->free)(session->userauth_pblc_method,&session->abstract);
      }
      if (session->userauth_kybd_data != (uchar *)0x0) {
        (*session->free)(session->userauth_kybd_data,&session->abstract);
      }
      if (session->userauth_kybd_packet != (uchar *)0x0) {
        (*session->free)(session->userauth_kybd_packet,&session->abstract);
      }
      if (session->userauth_kybd_auth_instruction != (uchar *)0x0) {
        (*session->free)(session->userauth_kybd_auth_instruction,&session->abstract);
      }
      if (session->open_packet != (uchar *)0x0) {
        (*session->free)(session->open_packet,&session->abstract);
      }
      if (session->open_data != (uchar *)0x0) {
        (*session->free)(session->open_data,&session->abstract);
      }
      if (session->direct_message != (uchar *)0x0) {
        (*session->free)(session->direct_message,&session->abstract);
      }
      if (session->fwdLstn_packet != (uchar *)0x0) {
        (*session->free)(session->fwdLstn_packet,&session->abstract);
      }
      if (session->pkeyInit_data != (uchar *)0x0) {
        (*session->free)(session->pkeyInit_data,&session->abstract);
      }
      if (session->scpRecv_command != (uchar *)0x0) {
        (*session->free)(session->scpRecv_command,&session->abstract);
      }
      if (session->scpSend_command != (uchar *)0x0) {
        (*session->free)(session->scpSend_command,&session->abstract);
      }
      if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
        (*session->free)(session->sftpInit_sftp,&session->abstract);
      }
      if ((session->packet).total_num != 0) {
        (*session->free)((session->packet).payload,&session->abstract);
      }
      entry = (list_node *)_libssh2_list_first(&session->packets);
      while (entry != (list_node *)0x0) {
        _libssh2_list_remove(entry);
        (*session->free)(entry[1].next,&session->abstract);
        (*session->free)(entry,&session->abstract);
        entry = (list_node *)_libssh2_list_first(&session->packets);
      }
      if (session->socket_prev_blockstate != 0) {
        iVar9 = session->socket_fd;
        uVar10 = fcntl(iVar9,3,0);
        fcntl(iVar9,4,(ulong)(uVar10 & 0xfffff7ff));
      }
      if (session->server_hostkey != (uchar *)0x0) {
        (*session->free)(session->server_hostkey,&session->abstract);
      }
      if ((session->err_msg != (char *)0x0) && ((session->err_flags & 1) != 0)) {
        (*session->free)(session->err_msg,&session->abstract);
      }
      (*session->free)(session,&session->abstract);
      bVar8 = false;
      iVar9 = 0;
    }
    if (!bVar8) {
      return iVar9;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar9 = _libssh2_wait_socket(session,start_time);
    if (iVar9 != 0) {
      return iVar9;
    }
  } while( true );
}

Assistant:

static int
session_free(LIBSSH2_SESSION *session)
{
    int rc;
    LIBSSH2_PACKET *pkg;
    LIBSSH2_CHANNEL *ch;
    LIBSSH2_LISTENER *l;
    int packets_left = 0;

    if(session->free_state == libssh2_NB_state_idle) {
        _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                       "Freeing session resource %p",
                       (void *)session->remote.banner));

        session->free_state = libssh2_NB_state_created;
    }

    if(session->free_state == libssh2_NB_state_created) {
        /* !checksrc! disable EQUALSNULL 1 */
        while((ch = _libssh2_list_first(&session->channels)) != NULL) {
            rc = _libssh2_channel_free(ch);
            if(rc == LIBSSH2_ERROR_EAGAIN)
                return rc;
        }

        session->free_state = libssh2_NB_state_sent;
    }

    if(session->free_state == libssh2_NB_state_sent) {
        /* !checksrc! disable EQUALSNULL 1 */
        while((l = _libssh2_list_first(&session->listeners)) != NULL) {
            rc = _libssh2_channel_forward_cancel(l);
            if(rc == LIBSSH2_ERROR_EAGAIN)
                return rc;
        }

        session->free_state = libssh2_NB_state_sent1;
    }

    if(session->state & LIBSSH2_STATE_NEWKEYS) {
        /* hostkey */
        if(session->hostkey && session->hostkey->dtor) {
            session->hostkey->dtor(session, &session->server_hostkey_abstract);
        }

        /* Client to Server */
        /* crypt */
        if(session->local.crypt && session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }
        /* comp */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }
        /* mac */
        if(session->local.mac && session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        /* Server to Client */
        /* crypt */
        if(session->remote.crypt && session->remote.crypt->dtor) {
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }
        /* comp */
        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }
        /* mac */
        if(session->remote.mac && session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        /* session_id */
        if(session->session_id) {
            LIBSSH2_FREE(session, session->session_id);
        }
    }

    /* Free banner(s) */
    if(session->remote.banner) {
        LIBSSH2_FREE(session, session->remote.banner);
    }
    if(session->local.banner) {
        LIBSSH2_FREE(session, session->local.banner);
    }

    /* Free preference(s) */
    if(session->kex_prefs) {
        LIBSSH2_FREE(session, session->kex_prefs);
    }
    if(session->hostkey_prefs) {
        LIBSSH2_FREE(session, session->hostkey_prefs);
    }

    if(session->local.kexinit) {
        LIBSSH2_FREE(session, session->local.kexinit);
    }
    if(session->local.crypt_prefs) {
        LIBSSH2_FREE(session, session->local.crypt_prefs);
    }
    if(session->local.mac_prefs) {
        LIBSSH2_FREE(session, session->local.mac_prefs);
    }
    if(session->local.comp_prefs) {
        LIBSSH2_FREE(session, session->local.comp_prefs);
    }
    if(session->local.lang_prefs) {
        LIBSSH2_FREE(session, session->local.lang_prefs);
    }

    if(session->remote.kexinit) {
        LIBSSH2_FREE(session, session->remote.kexinit);
    }
    if(session->remote.crypt_prefs) {
        LIBSSH2_FREE(session, session->remote.crypt_prefs);
    }
    if(session->remote.mac_prefs) {
        LIBSSH2_FREE(session, session->remote.mac_prefs);
    }
    if(session->remote.comp_prefs) {
        LIBSSH2_FREE(session, session->remote.comp_prefs);
    }
    if(session->remote.lang_prefs) {
        LIBSSH2_FREE(session, session->remote.lang_prefs);
    }
    if(session->server_sign_algorithms) {
        LIBSSH2_FREE(session, session->server_sign_algorithms);
    }
    if(session->sign_algo_prefs) {
        LIBSSH2_FREE(session, session->sign_algo_prefs);
    }

    /*
     * Make sure all memory used in the state variables are free
     */
    if(session->kexinit_data) {
        LIBSSH2_FREE(session, session->kexinit_data);
    }
    if(session->startup_data) {
        LIBSSH2_FREE(session, session->startup_data);
    }
    if(session->userauth_list_data) {
        LIBSSH2_FREE(session, session->userauth_list_data);
    }
    if(session->userauth_banner) {
        LIBSSH2_FREE(session, session->userauth_banner);
    }
    if(session->userauth_pswd_data) {
        LIBSSH2_FREE(session, session->userauth_pswd_data);
    }
    if(session->userauth_pswd_newpw) {
        LIBSSH2_FREE(session, session->userauth_pswd_newpw);
    }
    if(session->userauth_host_packet) {
        LIBSSH2_FREE(session, session->userauth_host_packet);
    }
    if(session->userauth_host_method) {
        LIBSSH2_FREE(session, session->userauth_host_method);
    }
    if(session->userauth_host_data) {
        LIBSSH2_FREE(session, session->userauth_host_data);
    }
    if(session->userauth_pblc_data) {
        LIBSSH2_FREE(session, session->userauth_pblc_data);
    }
    if(session->userauth_pblc_packet) {
        LIBSSH2_FREE(session, session->userauth_pblc_packet);
    }
    if(session->userauth_pblc_method) {
        LIBSSH2_FREE(session, session->userauth_pblc_method);
    }
    if(session->userauth_kybd_data) {
        LIBSSH2_FREE(session, session->userauth_kybd_data);
    }
    if(session->userauth_kybd_packet) {
        LIBSSH2_FREE(session, session->userauth_kybd_packet);
    }
    if(session->userauth_kybd_auth_instruction) {
        LIBSSH2_FREE(session, session->userauth_kybd_auth_instruction);
    }
    if(session->open_packet) {
        LIBSSH2_FREE(session, session->open_packet);
    }
    if(session->open_data) {
        LIBSSH2_FREE(session, session->open_data);
    }
    if(session->direct_message) {
        LIBSSH2_FREE(session, session->direct_message);
    }
    if(session->fwdLstn_packet) {
        LIBSSH2_FREE(session, session->fwdLstn_packet);
    }
    if(session->pkeyInit_data) {
        LIBSSH2_FREE(session, session->pkeyInit_data);
    }
    if(session->scpRecv_command) {
        LIBSSH2_FREE(session, session->scpRecv_command);
    }
    if(session->scpSend_command) {
        LIBSSH2_FREE(session, session->scpSend_command);
    }
    if(session->sftpInit_sftp) {
        LIBSSH2_FREE(session, session->sftpInit_sftp);
    }

    /* Free payload buffer */
    if(session->packet.total_num) {
        LIBSSH2_FREE(session, session->packet.payload);
    }

    /* Cleanup all remaining packets */
    /* !checksrc! disable EQUALSNULL 1 */
    while((pkg = _libssh2_list_first(&session->packets)) != NULL) {
        packets_left++;
        _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                       "packet left with id %d", pkg->data[0]));
        /* unlink the node */
        _libssh2_list_remove(&pkg->node);

        /* free */
        LIBSSH2_FREE(session, pkg->data);
        LIBSSH2_FREE(session, pkg);
    }
    (void)packets_left;
    _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                   "Extra packets left %d", packets_left));

    if(session->socket_prev_blockstate) {
        /* if the socket was previously blocking, put it back so */
        rc = session_nonblock(session->socket_fd, 0);
        if(rc) {
            _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                           "unable to reset socket's blocking state"));
        }
    }

    if(session->server_hostkey) {
        LIBSSH2_FREE(session, session->server_hostkey);
    }

    /* error string */
    if(session->err_msg &&
       ((session->err_flags & LIBSSH2_ERR_FLAG_DUP) != 0)) {
        LIBSSH2_FREE(session, (char *)session->err_msg);
    }

    LIBSSH2_FREE(session, session);

    return 0;
}